

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void print_cpp(duration<double,_std::ratio<1L,_1L>_> t,int n,string_view path,string_view func,
              string_view w,bool b)

{
  ostream *poVar1;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  fs_backend_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," x ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,func._M_str,func._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path._M_str,path._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") = ",4);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (w._M_len == 0) {
    std::ostream::_M_insert<bool>(true);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,w._M_str,w._M_len);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar1 = std::ostream::_M_insert<double>((double)(long)(t.__r * 1000000000.0) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," us\n",4);
  return;
}

Assistant:

void print_cpp(std::chrono::duration<double> t, int n, std::string_view path, std::string_view func, std::string_view w, bool b)
{
  std::chrono::nanoseconds ns = std::chrono::duration_cast<std::chrono::nanoseconds>(t);
  double us = static_cast<double>(ns.count()) / 1000.0;
  std::cout << fs_backend() << ": " << n << " x " << func << "(" << path << ") = ";
  if(w.empty())
    std::cout << b;
  else
    std::cout << w;
  std::cout << ": " << us << " us\n";
}